

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

void __thiscall FStateLabels::Destroy(FStateLabels *this)

{
  int local_14;
  int i;
  FStateLabels *this_local;
  
  for (local_14 = 0; local_14 < this->NumLabels; local_14 = local_14 + 1) {
    if (this->Labels[local_14].Children != (FStateLabels *)0x0) {
      Destroy(this->Labels[local_14].Children);
      free(this->Labels[local_14].Children);
      this->Labels[local_14].Children = (FStateLabels *)0x0;
    }
  }
  return;
}

Assistant:

void FStateLabels::Destroy ()
{
	for(int i = 0; i < NumLabels; i++)
	{
		if (Labels[i].Children != NULL)
		{
			Labels[i].Children->Destroy();
			free(Labels[i].Children);	// These are malloc'd, not new'd!
			Labels[i].Children = NULL;
		}
	}
}